

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

GlobalVariable * __thiscall hdc::Parser::parse_global_variable(Parser *this)

{
  Token *pTVar1;
  bool bVar2;
  Type *type;
  Expression *expression;
  GlobalVariable *this_00;
  Token name;
  undefined1 local_50 [16];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_40._M_p = (pointer)&local_30;
  expect(this,TK_VAR);
  expect(this,TK_ID);
  pTVar1 = (this->matched)._M_current;
  local_50._8_4_ = pTVar1->column;
  local_50._0_4_ = pTVar1->kind;
  local_50._4_4_ = pTVar1->line;
  std::__cxx11::string::_M_assign((string *)&local_40);
  bVar2 = match(this,TK_COLON);
  if (bVar2) {
    type = parse_type(this);
    bVar2 = match(this,TK_ASSIGNMENT);
    if (bVar2) {
      expression = parse_assignment_expression(this);
    }
    else {
      expression = (Expression *)0x0;
    }
  }
  else {
    expect(this,TK_ASSIGNMENT);
    expression = parse_assignment_expression(this);
    type = (Type *)0x0;
  }
  expect(this,TK_NEWLINE);
  this_00 = (GlobalVariable *)operator_new(0x78);
  GlobalVariable::GlobalVariable(this_00,(Token *)local_50,type,expression);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p);
  }
  return this_00;
}

Assistant:

GlobalVariable* Parser::parse_global_variable() {
    Token name;
    Type* type = nullptr;
    Expression* expression = nullptr;

    expect(TK_VAR);
    expect(TK_ID);
    name = *matched;

    if (match(TK_COLON)) {
        type = parse_type();

        if (match(TK_ASSIGNMENT)) {
            expression = parse_expression();
        }
    } else {
        expect(TK_ASSIGNMENT);
        expression = parse_expression();
    }

    expect(TK_NEWLINE);
    return new GlobalVariable(name, type, expression);
}